

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

bool __thiscall
QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>::endSeparatorMove
          (QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *this,QPoint *param_1)

{
  long lVar1;
  
  lVar1 = (this->movingSeparator).d.size;
  if (lVar1 != 0) {
    QList<int>::clear(&this->movingSeparator);
    QDockAreaLayoutInfo::clear((QDockAreaLayoutInfo *)&this[2].hoverSeparator.d.size);
  }
  return lVar1 != 0;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }